

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b44ExpLogTable.cpp
# Opt level: O2

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int i;
  long lVar2;
  float fVar3;
  undefined4 uStack_38;
  half h_1;
  half h;
  
  *(uint *)(expf + *(long *)(std::cout + -0x18)) =
       *(uint *)(expf + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  _uStack_38 = in_RAX;
  std::operator<<((ostream *)&std::cout,
                  "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n");
  std::operator<<((ostream *)&std::cout,"const unsigned short expTable[] =\n{\n    ");
  for (lVar2 = 0; lVar2 != 0x10000; lVar2 = lVar2 + 1) {
    _uStack_38 = CONCAT26((short)lVar2,_uStack_38);
    fVar3 = 0.0;
    if ((~(uint)lVar2 & 0x7c00) != 0) {
      fVar3 = 65504.0;
      if (half::_toFloat[lVar2].f < 88.71893) {
        fVar3 = expf(half::_toFloat[lVar2].f * 0.125);
      }
    }
    half::operator=(&h,fVar3);
    poVar1 = std::operator<<((ostream *)&std::cout,"0x");
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,h._h);
    std::operator<<(poVar1,", ");
    if ((~(uint)lVar2 & 7) == 0) {
      std::operator<<((ostream *)&std::cout,"\n");
      if (lVar2 != 0xffff) {
        std::operator<<((ostream *)&std::cout,"    ");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n\n");
  std::operator<<((ostream *)&std::cout,"const unsigned short logTable[] =\n{\n    ");
  for (lVar2 = 0; lVar2 != 0x10000; lVar2 = lVar2 + 1) {
    _uStack_38 = CONCAT24((short)lVar2,uStack_38);
    fVar3 = 0.0;
    if (((~(uint)lVar2 & 0x7c00) != 0) && (fVar3 = 0.0, 0.0 <= half::_toFloat[lVar2].f)) {
      fVar3 = logf(half::_toFloat[lVar2].f);
      fVar3 = fVar3 * 8.0;
    }
    half::operator=(&h_1,fVar3);
    poVar1 = std::operator<<((ostream *)&std::cout,"0x");
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,h_1._h);
    std::operator<<(poVar1,", ");
    if ((~(uint)lVar2 & 7) == 0) {
      std::operator<<((ostream *)&std::cout,"\n");
      if (lVar2 != 0xffff) {
        std::operator<<((ostream *)&std::cout,"    ");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int
main ()
{
#ifndef HAVE_IOS_BASE
    cout.setf (ios::hex, ios::basefield);
#else
    cout.setf (ios_base::hex, ios_base::basefield);
#endif

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    const int iMax = (1 << 16);

    cout << "const unsigned short expTable[] =\n"
	    "{\n"
	    "    ";

    for (int i = 0; i < iMax; i++)
    {
	half h;
	h.setBits (i);

	if (!h.isFinite())
	    h = 0;
	else if (h >= 8 * log (HALF_MAX))
	    h = HALF_MAX;
	else
	    h = exp (h / 8);

	cout << "0x" << setfill ('0') << setw (4) << h.bits() << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n\n";

    cout << "const unsigned short logTable[] =\n"
	    "{\n"
	    "    ";

    for (int i = 0; i < iMax; i++)
    {
	half h;
	h.setBits (i);

	if (!h.isFinite() || h < 0)
	    h = 0;
	else
	    h = 8 * log (h);

	cout << "0x" << setfill ('0') << setw (4) << h.bits() << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n";

    return 0;
}